

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O0

void __thiscall Js::SourceTextModuleRecord::NotifyParentsAsNeeded(SourceTextModuleRecord *this)

{
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  **ppLVar1;
  List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  SourceTextModuleRecord *this_local;
  
  if ((this->notifying & 1U) == 0) {
    this->notifying = true;
    ppLVar1 = Memory::WriteBarrierPtr::operator_cast_to_List__
                        ((WriteBarrierPtr *)&this->parentModuleList);
    if (*ppLVar1 !=
        (List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)0x0) {
      this_00 = Memory::
                WriteBarrierPtr<JsUtil::List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                ::operator->(&this->parentModuleList);
      JsUtil::
      List<Js::SourceTextModuleRecord*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
      ::Map<Js::SourceTextModuleRecord::NotifyParentsAsNeeded()::__0>
                ((List<Js::SourceTextModuleRecord*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                  *)this_00,(anon_class_8_1_8991fb9c)this);
    }
    this->notifying = false;
    SetParentsNotified(this);
  }
  return;
}

Assistant:

void SourceTextModuleRecord::NotifyParentsAsNeeded()
    {
        if (notifying)
        {
            return;
        }
        notifying = true;
        // Notify the parent modules that this child module is either in fault state or finished.
        if (this->parentModuleList != nullptr)
        {
            parentModuleList->Map([=](uint i, SourceTextModuleRecord* parentModule)
            {
                parentModule->OnChildModuleReady(this, this->errorObject);
            });
        }
        notifying = false;
        SetParentsNotified();
    }